

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

char * skip_white(char *s)

{
  ushort **ppuVar1;
  char *local_18;
  char *s_local;
  
  local_18 = s;
  if (s != (char *)0x0) {
    for (; *local_18 != '\0'; local_18 = local_18 + 1) {
      if ((*local_18 == '\n') || (*local_18 == '\r')) {
        return (char *)0x0;
      }
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)*local_18] & 0x2000) == 0) {
        return local_18;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *skip_white(char *s)
{
    if (s != NULL) {
        while (*s) {
            if (*s == '\n' || *s == '\r') {
                return NULL;
            }
            if (isspace(*s)) {
                ++s;
                continue;
            }
            return s;
        }
    }
    return NULL;
}